

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O2

void __thiscall
Secp256k1_EmptyContextErrorTest_Test::Secp256k1_EmptyContextErrorTest_Test
          (Secp256k1_EmptyContextErrorTest_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_005cbe28;
  return;
}

Assistant:

TEST(Secp256k1, EmptyContextErrorTest) {
  struct secp256k1_context_struct *cxt = nullptr;
  Secp256k1 secp = Secp256k1(cxt);

  std::vector<ByteData> test_vector =
      { ByteData(
          "03662a01c232918c9deb3b330272483c3e4ec0c6b5da86df59252835afeb4ab5f9"),
          ByteData(
              "0261e37f277f02a977b4f11eb5055abab4990bbf8dee701119d88df382fcc1fafe") };
  EXPECT_THROW(ByteData actual = secp.CombinePubkeySecp256k1Ec(test_vector),
               CfdException);
}